

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

void __thiscall QSlider::mouseReleaseEvent(QSlider *this,QMouseEvent *ev)

{
  undefined8 uVar1;
  QFlagsStorage<QStyle::SubControl> QVar2;
  long lVar3;
  QStyle *pQVar4;
  long lVar5;
  undefined8 *puVar6;
  QStyleOptionSlider *pQVar7;
  long in_FS_OFFSET;
  byte bVar8;
  QRect local_b0;
  QStyleOptionSlider opt;
  
  bVar8 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  QVar2.i = ((QFlagsStorage<QStyle::SubControl> *)(lVar5 + 0x290))->i;
  if ((QVar2.i == 0) || (*(int *)(ev + 0x44) != 0)) {
    ev[0xc] = (QMouseEvent)0x0;
  }
  else {
    ev[0xc] = (QMouseEvent)0x1;
    *(undefined4 *)(lVar5 + 0x290) = 0;
    QAbstractSlider::setRepeatAction(&this->super_QAbstractSlider,SliderNoAction,500,0x32);
    if (QVar2.i == 2) {
      QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,false);
    }
    puVar6 = &DAT_00661f50;
    pQVar7 = &opt;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      uVar1 = *puVar6;
      (pQVar7->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
      (pQVar7->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
      pQVar7 = (QStyleOptionSlider *)((long)pQVar7 + (ulong)bVar8 * -0x10 + 8);
    }
    QStyleOptionSlider::QStyleOptionSlider(&opt);
    (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&opt);
    opt.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
    super_QFlagsStorage<QStyle::SubControl>.i =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)
         (QFlagsStorageHelper<QStyle::SubControl,_4>)QVar2;
    pQVar4 = QWidget::style((QWidget *)this);
    local_b0 = (QRect)(**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,3,&opt,QVar2.i,this);
    QWidget::update((QWidget *)this,&local_b0);
    QStyleOption::~QStyleOption((QStyleOption *)&opt);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSlider::mouseReleaseEvent(QMouseEvent *ev)
{
    Q_D(QSlider);
    if (d->pressedControl == QStyle::SC_None || ev->buttons()) {
        ev->ignore();
        return;
    }
    ev->accept();
    QStyle::SubControl oldPressed = QStyle::SubControl(d->pressedControl);
    d->pressedControl = QStyle::SC_None;
    setRepeatAction(SliderNoAction);
    if (oldPressed == QStyle::SC_SliderHandle)
        setSliderDown(false);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.subControls = oldPressed;
    update(style()->subControlRect(QStyle::CC_Slider, &opt, oldPressed, this));
}